

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCallback.cpp
# Opt level: O0

void __thiscall MyEmitter::emitMySignal3(MyEmitter *this)

{
  String local_38;
  MyEmitter *local_10;
  MyEmitter *this_local;
  
  local_10 = this;
  String::String<5ul>(&local_38,(char (*) [5])"test");
  Callback::Emitter::emit<MyEmitter,String_const&>(&this->super_Emitter,0x29,(String *)0x0);
  String::~String(&local_38);
  return;
}

Assistant:

void emitMySignal3()
  {
    emit<MyEmitter, const String&>(&MyEmitter::mySignal3, "test");
  }